

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

void cs_impl::hash_set_cs_ext::insert(hash_set *set,var *val)

{
  any local_30;
  any local_28;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>::iterator,_bool>
  local_20;
  
  local_28.mDat = val->mDat;
  if (local_28.mDat != (proxy *)0x0) {
    (local_28.mDat)->refcount = (local_28.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&local_30,(EVP_PKEY_CTX *)&local_28);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  ::emplace<cs_impl::any,_0>
            (&local_20,
             &set->
              super_raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
             ,&local_30);
  any::recycle(&local_30);
  any::recycle(&local_28);
  return;
}

Assistant:

void insert(hash_set &set, const var &val)
		{
			set.insert(copy(val));
		}